

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeTree.cpp
# Opt level: O0

bool __thiscall Indexing::CodeTree::RemovingMatcher<true>::doCheckVar(RemovingMatcher<true> *this)

{
  uint uVar1;
  uint uVar2;
  uint *puVar3;
  long in_RDI;
  Entry *fte;
  uint var;
  
  uVar1 = CodeOp::_arg((CodeOp *)0x3492fb);
  Kernel::FlatTerm::operator[](*(FlatTerm **)(in_RDI + 0x10),*(size_t *)(in_RDI + 8));
  uVar2 = Kernel::FlatTerm::Entry::_tag((Entry *)0x349322);
  if (uVar2 == 2) {
    puVar3 = Lib::DArray<unsigned_int>::operator[]
                       ((DArray<unsigned_int> *)(in_RDI + 0x18),(ulong)uVar1);
    uVar1 = *puVar3;
    uVar2 = Kernel::FlatTerm::Entry::_number((Entry *)0x34934b);
    if (uVar1 == uVar2) {
      *(long *)(in_RDI + 8) = *(long *)(in_RDI + 8) + 1;
      return true;
    }
  }
  return false;
}

Assistant:

inline bool CodeTree::RemovingMatcher<checkRange>::doCheckVar()
{
  ASS_EQ(op->_instruction(), CHECK_VAR);

  //we are looking for variants and they match only other variables into variables
  unsigned var=op->_arg();
  const FlatTerm::Entry* fte=&(*ft)[tp];
  if(fte->_tag()!=FlatTerm::VAR || bindings[var]!=fte->_number()) {
    return false;
  }
  tp++;
  return true;
}